

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O3

int __thiscall
ON_UuidPairList2::GetId1s(ON_UuidPairList2 *this,ON_SimpleArray<ON_UUID_struct> *uuid_list)

{
  _Head_base<0UL,_ON_UuidPairList2_Private_*,_false> _Var1;
  int iVar2;
  ulong new_capacity;
  _Hash_node_base *p_Var3;
  
  _Var1._M_head_impl =
       (this->m_private)._M_t.
       super___uniq_ptr_impl<ON_UuidPairList2_Private,_std::default_delete<ON_UuidPairList2_Private>_>
       ._M_t.
       super__Tuple_impl<0UL,_ON_UuidPairList2_Private_*,_std::default_delete<ON_UuidPairList2_Private>_>
       .super__Head_base<0UL,_ON_UuidPairList2_Private_*,_false>._M_head_impl;
  new_capacity = (ulong)*(uint *)((long)&(_Var1._M_head_impl)->
                                         super_ON_UuidList2_Private<ON_UUID_struct> + 0x18);
  if ((ulong)(long)uuid_list->m_capacity < new_capacity) {
    ON_SimpleArray<ON_UUID_struct>::SetCapacity(uuid_list,new_capacity);
    _Var1._M_head_impl =
         (this->m_private)._M_t.
         super___uniq_ptr_impl<ON_UuidPairList2_Private,_std::default_delete<ON_UuidPairList2_Private>_>
         ._M_t.
         super__Tuple_impl<0UL,_ON_UuidPairList2_Private_*,_std::default_delete<ON_UuidPairList2_Private>_>
         .super__Head_base<0UL,_ON_UuidPairList2_Private_*,_false>._M_head_impl;
  }
  iVar2 = 0;
  for (p_Var3 = ((__node_base *)
                ((long)&((_Var1._M_head_impl)->super_ON_UuidList2_Private<ON_UUID_struct>).map +
                0x10))->_M_nxt; p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
    ON_SimpleArray<ON_UUID_struct>::Append(uuid_list,(ON_UUID_struct *)(p_Var3 + 1));
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

int ON_UuidPairList2::GetId1s(ON_SimpleArray<ON_UUID>& uuid_list) const
{
  uuid_list.Reserve(Count());

  int i = 0;
  for (const auto& pair : m_private->map)
  {
    uuid_list.Append(pair.first);
    i++;
  }
  return i;
}